

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_util.cpp
# Opt level: O1

bool bin_io::file_exists(char *filename)

{
  uint uVar1;
  fstream ff;
  long local_220 [4];
  uint auStack_200 [124];
  
  std::fstream::fstream(local_220);
  std::fstream::open((char *)local_220,(_Ios_Openmode)filename);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    std::fstream::close();
  }
  std::fstream::~fstream(local_220);
  return (uVar1 & 5) == 0;
}

Assistant:

bool file_exists(const char* filename) {
    std::fstream ff;
    ff.open(filename, std::fstream::in | std::fstream::binary);
    if (ff.fail()) {
        #ifdef DEBUG
            std::cout << "file_exists(): File does NOT exist: " << filename << std::endl;
        #endif
        return false;
    }
    #ifdef DEBUG
        std::cout << "file_exists(): File DOES exist: " << filename << std::endl;
    #endif
    ff.close();
    return true;
}